

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# civetweb.c
# Opt level: O0

mg_connection *
mg_connect_client_impl
          (mg_client_options *client_options,int use_ssl,mg_init_data *init,mg_error_data *error)

{
  char *buflen;
  mg_connection *conn_00;
  int iVar1;
  int *piVar2;
  char *pcVar3;
  char *pcVar4;
  ulong uVar5;
  usa *local_a0;
  size_t alloc_size;
  size_t ctx_size;
  size_t conn_size;
  uint max_req_size;
  socklen_t len;
  sockaddr *psa;
  usa sa;
  SOCKET sock;
  mg_connection *conn;
  mg_error_data *error_local;
  mg_init_data *init_local;
  mg_client_options *pmStack_18;
  int use_ssl_local;
  mg_client_options *client_options_local;
  
  stack0xffffffffffffffc8 = (mg_connection *)0x0;
  conn = (mg_connection *)error;
  error_local = (mg_error_data *)init;
  init_local._4_4_ = use_ssl;
  pmStack_18 = client_options;
  conn_size._0_4_ = atoi("16384");
  uVar5 = (ulong)(uint)conn_size;
  register0x00000000 = (mg_connection *)mg_calloc(1,uVar5 + 0x28f90);
  if (conn != (mg_connection *)0x0) {
    conn->connection_type = 0;
    conn->protocol_type = 0;
    if ((conn->request_info).request_method != (char *)0x0) {
      **(undefined1 **)&conn->request_state = 0;
    }
  }
  if (register0x00000000 == (mg_connection *)0x0) {
    if (conn != (mg_connection *)0x0) {
      conn->connection_type = 6;
      conn->protocol_type = (int)(uVar5 + 0x28f90);
      pcVar4 = *(char **)&conn->request_state;
      buflen = (conn->request_info).request_method;
      piVar2 = __errno_location();
      pcVar3 = strerror(*piVar2);
      mg_snprintf((mg_connection *)0x0,(int *)0x0,pcVar4,(size_t)buflen,"calloc(): %s",pcVar3);
    }
    client_options_local = (mg_client_options *)0x0;
  }
  else {
    register0x00000000->phys_ctx = (mg_context *)(register0x00000000 + 1);
    register0x00000000->buf =
         (char *)&register0x00000000[0x42].request_info.http_headers[0x11].value;
    register0x00000000->buf_size = (uint)conn_size;
    register0x00000000->phys_ctx->context_type = 2;
    register0x00000000->dom_ctx = &register0x00000000->phys_ctx->dd;
    iVar1 = connect_socket(register0x00000000->phys_ctx,pmStack_18->host,pmStack_18->port,
                           init_local._4_4_,(mg_error_data *)conn,
                           (SOCKET *)(sa.sin6.sin6_addr.__in6_u.__u6_addr32 + 3),(usa *)&psa);
    if (iVar1 == 0) {
      mg_free(stack0xffffffffffffffc8);
      client_options_local = (mg_client_options *)0x0;
    }
    else {
      conn_size._4_4_ = 0x1c;
      if ((short)psa == 2) {
        conn_size._4_4_ = 0x10;
      }
      local_a0 = &(stack0xffffffffffffffc8->client).rsa;
      _max_req_size = local_a0;
      (stack0xffffffffffffffc8->client).sock = sa._20_4_;
      *(ulong *)&(stack0xffffffffffffffc8->client).lsa = CONCAT62(psa._2_6_,(short)psa);
      *(undefined8 *)((long)&(stack0xffffffffffffffc8->client).lsa + 8) = sa._0_8_;
      *(uchar (*) [8])((long)&(stack0xffffffffffffffc8->client).lsa + 0x10) = sa.sin.sin_zero;
      (stack0xffffffffffffffc8->client).lsa.sin6.sin6_scope_id = sa._16_4_;
      iVar1 = getsockname(sa._20_4_,(sockaddr *)&local_a0->sa,(socklen_t *)((long)&conn_size + 4));
      conn_00 = stack0xffffffffffffffc8;
      if (iVar1 != 0) {
        piVar2 = __errno_location();
        pcVar4 = strerror(*piVar2);
        mg_cry_internal_wrap
                  (conn_00,(mg_context *)0x0,"mg_connect_client_impl",0x46db,
                   "%s: getsockname() failed: %s","mg_connect_client_impl",pcVar4);
      }
      (stack0xffffffffffffffc8->client).is_ssl = init_local._4_4_ != 0;
      iVar1 = pthread_mutex_init((pthread_mutex_t *)&stack0xffffffffffffffc8->mutex,
                                 (pthread_mutexattr_t *)&pthread_mutex_attr);
      if (iVar1 == 0) {
        client_options_local = (mg_client_options *)stack0xffffffffffffffc8;
      }
      else {
        if (conn != (mg_connection *)0x0) {
          conn->connection_type = 9;
          piVar2 = __errno_location();
          conn->protocol_type = *piVar2;
          mg_snprintf((mg_connection *)0x0,(int *)0x0,*(char **)&conn->request_state,
                      (size_t)(conn->request_info).request_method,"Can not create mutex");
        }
        close(sa._20_4_);
        mg_free(stack0xffffffffffffffc8);
        client_options_local = (mg_client_options *)0x0;
      }
    }
  }
  return (mg_connection *)client_options_local;
}

Assistant:

static struct mg_connection *
mg_connect_client_impl(const struct mg_client_options *client_options,
                       int use_ssl,
                       struct mg_init_data *init,
                       struct mg_error_data *error)
{
	struct mg_connection *conn = NULL;
	SOCKET sock;
	union usa sa;
	struct sockaddr *psa;
	socklen_t len;

	unsigned max_req_size =
	    (unsigned)atoi(config_options[MAX_REQUEST_SIZE].default_value);

	/* Size of structures, aligned to 8 bytes */
	size_t conn_size = ((sizeof(struct mg_connection) + 7) >> 3) << 3;
	size_t ctx_size = ((sizeof(struct mg_context) + 7) >> 3) << 3;
	size_t alloc_size = conn_size + ctx_size + max_req_size;

	(void)init; /* TODO: Implement required options */

	conn = (struct mg_connection *)mg_calloc(1, alloc_size);

	if (error != NULL) {
		error->code = MG_ERROR_DATA_CODE_OK;
		error->code_sub = 0;
		if (error->text_buffer_size > 0) {
			error->text[0] = 0;
		}
	}

	if (conn == NULL) {
		if (error != NULL) {
			error->code = MG_ERROR_DATA_CODE_OUT_OF_MEMORY;
			error->code_sub = (unsigned)alloc_size;
			mg_snprintf(NULL,
			            NULL, /* No truncation check for ebuf */
			            error->text,
			            error->text_buffer_size,
			            "calloc(): %s",
			            strerror(ERRNO));
		}
		return NULL;
	}

#if defined(GCC_DIAGNOSTIC)
#pragma GCC diagnostic push
#pragma GCC diagnostic ignored "-Wcast-align"
#endif /* defined(GCC_DIAGNOSTIC) */
	/* conn_size is aligned to 8 bytes */

	conn->phys_ctx = (struct mg_context *)(((char *)conn) + conn_size);

#if defined(GCC_DIAGNOSTIC)
#pragma GCC diagnostic pop
#endif /* defined(GCC_DIAGNOSTIC) */

	conn->buf = (((char *)conn) + conn_size + ctx_size);
	conn->buf_size = (int)max_req_size;
	conn->phys_ctx->context_type = CONTEXT_HTTP_CLIENT;
	conn->dom_ctx = &(conn->phys_ctx->dd);

	if (!connect_socket(conn->phys_ctx,
	                    client_options->host,
	                    client_options->port,
	                    use_ssl,
	                    error,
	                    &sock,
	                    &sa)) {
		/* "error" will be set by connect_socket. */
		/* free all memory and return NULL; */
		mg_free(conn);
		return NULL;
	}

#if !defined(NO_SSL) && !defined(USE_MBEDTLS) // TODO: mbedTLS client
#if (defined(OPENSSL_API_1_1) || defined(OPENSSL_API_3_0))                     \
    && !defined(NO_SSL_DL)

	if (use_ssl
	    && (conn->dom_ctx->ssl_ctx = SSL_CTX_new(TLS_client_method()))
	           == NULL) {
		if (error != NULL) {
			error->code = MG_ERROR_DATA_CODE_INIT_TLS_FAILED;
			mg_snprintf(NULL,
			            NULL, /* No truncation check for ebuf */
			            error->text,
			            error->text_buffer_size,
			            "SSL_CTX_new error: %s",
			            ssl_error());
		}

		closesocket(sock);
		mg_free(conn);
		return NULL;
	}

#else

	if (use_ssl
	    && (conn->dom_ctx->ssl_ctx = SSL_CTX_new(SSLv23_client_method()))
	           == NULL) {
		if (error != NULL) {
			error->code = MG_ERROR_DATA_CODE_INIT_TLS_FAILED;
			mg_snprintf(NULL,
			            NULL, /* No truncation check for ebuf */
			            error->text,
			            error->text_buffer_size,
			            "SSL_CTX_new error: %s",
			            ssl_error());
		}

		closesocket(sock);
		mg_free(conn);
		return NULL;
	}

#endif /* OPENSSL_API_1_1 || OPENSSL_API_3_0 */
#endif /* NO_SSL */

#if defined(USE_IPV6)
	len = (sa.sa.sa_family == AF_INET) ? sizeof(conn->client.rsa.sin)
	                                   : sizeof(conn->client.rsa.sin6);
	psa = (sa.sa.sa_family == AF_INET)
	          ? (struct sockaddr *)&(conn->client.rsa.sin)
	          : (struct sockaddr *)&(conn->client.rsa.sin6);
#else
	len = sizeof(conn->client.rsa.sin);
	psa = (struct sockaddr *)&(conn->client.rsa.sin);
#endif

	conn->client.sock = sock;
	conn->client.lsa = sa;

	if (getsockname(sock, psa, &len) != 0) {
		mg_cry_internal(conn,
		                "%s: getsockname() failed: %s",
		                __func__,
		                strerror(ERRNO));
	}

	conn->client.is_ssl = use_ssl ? 1 : 0;
	if (0 != pthread_mutex_init(&conn->mutex, &pthread_mutex_attr)) {
		if (error != NULL) {
			error->code = MG_ERROR_DATA_CODE_OS_ERROR;
			error->code_sub = (unsigned)ERRNO;
			mg_snprintf(NULL,
			            NULL, /* No truncation check for ebuf */
			            error->text,
			            error->text_buffer_size,
			            "Can not create mutex");
		}
#if !defined(NO_SSL) && !defined(USE_MBEDTLS) // TODO: mbedTLS client
		SSL_CTX_free(conn->dom_ctx->ssl_ctx);
#endif
		closesocket(sock);
		mg_free(conn);
		return NULL;
	}

#if !defined(NO_SSL) && !defined(USE_MBEDTLS) // TODO: mbedTLS client
	if (use_ssl) {
		/* TODO: Check ssl_verify_peer and ssl_ca_path here.
		 * SSL_CTX_set_verify call is needed to switch off server
		 * certificate checking, which is off by default in OpenSSL and
		 * on in yaSSL. */
		/* TODO: SSL_CTX_set_verify(conn->dom_ctx,
		 * SSL_VERIFY_PEER, verify_ssl_server); */

		if (client_options->client_cert) {
			if (!ssl_use_pem_file(conn->phys_ctx,
			                      conn->dom_ctx,
			                      client_options->client_cert,
			                      NULL)) {
				if (error != NULL) {
					error->code = MG_ERROR_DATA_CODE_TLS_CLIENT_CERT_ERROR;
					mg_snprintf(NULL,
					            NULL, /* No truncation check for ebuf */
					            error->text,
					            error->text_buffer_size,
					            "Can not use SSL client certificate");
				}

				SSL_CTX_free(conn->dom_ctx->ssl_ctx);
				closesocket(sock);
				mg_free(conn);
				return NULL;
			}
		}

		if (client_options->server_cert) {
			if (SSL_CTX_load_verify_locations(conn->dom_ctx->ssl_ctx,
			                                  client_options->server_cert,
			                                  NULL)
			    != 1) {
				if (error != NULL) {
					error->code = MG_ERROR_DATA_CODE_TLS_SERVER_CERT_ERROR;
					mg_snprintf(NULL,
					            NULL, /* No truncation check for ebuf */
					            error->text,
					            error->text_buffer_size,
					            "SSL_CTX_load_verify_locations error: %s",
					            ssl_error());
				}
				SSL_CTX_free(conn->dom_ctx->ssl_ctx);
				closesocket(sock);
				mg_free(conn);
				return NULL;
			}
			SSL_CTX_set_verify(conn->dom_ctx->ssl_ctx, SSL_VERIFY_PEER, NULL);
		} else {
			SSL_CTX_set_verify(conn->dom_ctx->ssl_ctx, SSL_VERIFY_NONE, NULL);
		}

		if (!sslize(conn, SSL_connect, client_options)) {
			if (error != NULL) {
				error->code = MG_ERROR_DATA_CODE_TLS_CONNECT_ERROR;
				mg_snprintf(NULL,
				            NULL, /* No truncation check for ebuf */
				            error->text,
				            error->text_buffer_size,
				            "SSL connection error");
			}
			SSL_CTX_free(conn->dom_ctx->ssl_ctx);
			closesocket(sock);
			mg_free(conn);
			return NULL;
		}
	}
#endif

	return conn;
}